

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

iterator __thiscall
absl::lts_20250127::container_internal::
btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
::internal_emplace<google::protobuf::Descriptor_const*const&>
          (btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
           *this,iterator iter,Descriptor **args)

{
  btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
  *old_node;
  btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
  bVar1;
  bool bVar2;
  btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
  *this_00;
  byte max_count;
  btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
  bVar3;
  iterator iVar4;
  anon_class_8_1_a7a39255 transfer_and_delete;
  allocator_type *alloc;
  DescCompare local_51;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>,_const_google::protobuf::Descriptor_*const_&,_const_google::protobuf::Descriptor_*const_*>
  local_50;
  anon_class_8_1_a7a39255 local_40;
  allocator<const_google::protobuf::Descriptor_*> *local_38;
  
  local_50.node_ =
       (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
        *)iter.node_;
  local_50.position_ = iter.position_;
  if (((undefined1  [16])iter & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    if (((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
          *)local_50.node_)[0xb] ==
        (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
         )0x0) {
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>,_const_google::protobuf::Descriptor_*const_&,_const_google::protobuf::Descriptor_*const_*>
      ::decrement(&local_50);
      local_50.position_ = local_50.position_ + 1;
    }
    if (((ulong)local_50.node_ & 7) == 0) {
      bVar3 = (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
               )0x1e;
      if (local_50.node_[0xb] !=
          (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
           )0x0) {
        bVar3 = local_50.node_[0xb];
      }
      local_40.alloc = &local_38;
      local_38 = (allocator<const_google::protobuf::Descriptor_*> *)(this + 8);
      bVar1 = (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
               )btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
                ::count(local_50.node_);
      old_node = local_50.node_;
      if (bVar1 == bVar3) {
        if ((byte)bVar3 < 0x1e) {
          if (local_50.node_ != *(node_type **)this) {
            __assert_fail("iter.node_ == root()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                          ,0xb10,
                          "auto absl::container_internal::btree<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>>::internal_emplace(iterator, const google::protobuf::Descriptor *const &)::(anonymous class)::operator()(field_type) const [Params = absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>]"
                         );
          }
          max_count = 0x1e;
          if ((byte)((char)bVar3 * '\x02') < 0x1e) {
            max_count = (char)bVar3 * '\x02';
          }
          this_00 = (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
                     *)Allocate<8ul,std::allocator<google::protobuf::Descriptor_const*>>
                                 ((allocator<const_google::protobuf::Descriptor_*> *)(this + 8),
                                  (ulong)((uint)max_count * 8 + 0x10));
          btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
          ::init_leaf(this_00,'\0',max_count,this_00);
          local_50.node_ = this_00;
          btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
          ::internal_emplace<const_google::protobuf::Descriptor_*const_&>::anon_class_8_1_a7a39255::
          operator()(&local_40,old_node,this_00);
          *(btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
            **)(this + 8) = this_00;
          *(btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
            **)this = this_00;
        }
        else {
          btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
          ::rebalance_or_split
                    ((btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
                      *)this,(iterator *)&local_50);
        }
      }
      btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
      ::emplace_value<google::protobuf::Descriptor_const*const&>
                ((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
                  *)local_50.node_,(field_type)local_50.position_,local_38,args);
      bVar2 = btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
              ::
              is_ordered_correctly<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare>
                        (local_50.node_,(field_type)local_50.position_,&local_51);
      if (bVar2) {
        *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
        iVar4.position_ = local_50.position_;
        iVar4.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                       *)local_50.node_;
        iVar4._12_4_ = 0;
        return iVar4;
      }
      __assert_fail("iter.node_->is_ordered_correctly(static_cast<field_type>(iter.position_), original_key_compare(key_comp())) && \"If this assert fails, then either (1) the comparator may violate \" \"transitivity, i.e. comp(a,b) && comp(b,c) -> comp(a,c) (see \" \"https://en.cppreference.com/w/cpp/named_req/Compare), or (2) a \" \"key may have been mutated after it was inserted into the tree.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                    ,0xb42,
                    "iterator absl::container_internal::btree<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>>::internal_emplace(iterator, Args &&...) [Params = absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>, Args = <const google::protobuf::Descriptor *const &>]"
                   );
    }
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::Descriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::Descriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
               );
}

Assistant:

inline auto btree<P>::internal_emplace(iterator iter, Args &&...args)
    -> iterator {
  if (iter.node_->is_internal()) {
    // We can't insert on an internal node. Instead, we'll insert after the
    // previous value which is guaranteed to be on a leaf node.
    --iter;
    ++iter.position_;
  }
  const field_type max_count = iter.node_->max_count();
  allocator_type *alloc = mutable_allocator();

  const auto transfer_and_delete = [&](node_type *old_node,
                                       node_type *new_node) {
    new_node->transfer_n(old_node->count(), new_node->start(),
                         old_node->start(), old_node, alloc);
    new_node->set_finish(old_node->finish());
    old_node->set_finish(old_node->start());
    new_node->set_generation(old_node->generation());
    node_type::clear_and_delete(old_node, alloc);
  };
  const auto replace_leaf_root_node = [&](field_type new_node_size) {
    assert(iter.node_ == root());
    node_type *old_root = iter.node_;
    node_type *new_root = iter.node_ = new_leaf_root_node(new_node_size);
    transfer_and_delete(old_root, new_root);
    mutable_root() = mutable_rightmost() = new_root;
  };

  bool replaced_node = false;
  if (iter.node_->count() == max_count) {
    // Make room in the leaf for the new item.
    if (max_count < kNodeSlots) {
      // Insertion into the root where the root is smaller than the full node
      // size. Simply grow the size of the root node.
      replace_leaf_root_node(static_cast<field_type>(
          (std::min)(static_cast<int>(kNodeSlots), 2 * max_count)));
      replaced_node = true;
    } else {
      rebalance_or_split(&iter);
    }
  }
  (void)replaced_node;
#if defined(ABSL_HAVE_ADDRESS_SANITIZER) || \
    defined(ABSL_HAVE_HWADDRESS_SANITIZER)
  if (!replaced_node) {
    assert(iter.node_->is_leaf());
    if (iter.node_->is_root()) {
      replace_leaf_root_node(max_count);
    } else {
      node_type *old_node = iter.node_;
      const bool was_rightmost = rightmost() == old_node;
      const bool was_leftmost = leftmost() == old_node;
      node_type *parent = old_node->parent();
      const field_type position = old_node->position();
      node_type *new_node = iter.node_ = new_leaf_node(position, parent);
      parent->set_child_noupdate_position(position, new_node);
      transfer_and_delete(old_node, new_node);
      if (was_rightmost) mutable_rightmost() = new_node;
      // The leftmost node is stored as the parent of the root node.
      if (was_leftmost) root()->set_parent(new_node);
    }
  }
#endif
  iter.node_->emplace_value(static_cast<field_type>(iter.position_), alloc,
                            std::forward<Args>(args)...);
  assert(
      iter.node_->is_ordered_correctly(static_cast<field_type>(iter.position_),
                                       original_key_compare(key_comp())) &&
      "If this assert fails, then either (1) the comparator may violate "
      "transitivity, i.e. comp(a,b) && comp(b,c) -> comp(a,c) (see "
      "https://en.cppreference.com/w/cpp/named_req/Compare), or (2) a "
      "key may have been mutated after it was inserted into the tree.");
  ++size_;
  iter.update_generation();
  return iter;
}